

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention.cpp
# Opt level: O1

int __thiscall
ncnn::MultiHeadAttention::forward
          (MultiHeadAttention *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint _h;
  uint _h_00;
  pointer pMVar1;
  Mat *this_00;
  size_t sVar2;
  int iVar3;
  uint _w;
  uint _w_00;
  long lVar4;
  int *piVar5;
  int iVar6;
  ulong uVar7;
  void *pvVar8;
  long lVar9;
  void *pvVar10;
  ulong uVar11;
  void *pvVar12;
  ulong uVar13;
  void *pvVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  void *pvVar18;
  float fVar19;
  float fVar20;
  void *local_258;
  long local_248;
  long *local_240;
  int *local_230;
  int local_21c;
  long local_218;
  long local_210;
  Mat local_208;
  long local_1c0;
  long local_1b8;
  pointer local_1b0;
  long local_1a8;
  long local_1a0;
  Mat local_198;
  Mat local_148;
  Mat local_f8;
  long local_b0;
  long local_a8;
  Mat *local_a0;
  pointer local_98;
  long local_90;
  pointer local_88;
  long local_80;
  Mat local_78;
  
  if (this->int8_scale_term == 0) {
    pMVar1 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pMVar1;
    local_88 = pMVar1;
    if (lVar4 != 0x48) {
      lVar9 = 0;
      if (this->attn_mask == 0) {
        lVar9 = 0x48;
      }
      if (lVar4 != 0x90) {
        lVar9 = 0x48;
      }
      local_88 = (pointer)((long)&pMVar1->data + lVar9);
    }
    local_1b0 = pMVar1;
    if ((lVar4 != 0x48) && (this->attn_mask == 0 || lVar4 != 0x90)) {
      local_1b0 = local_88;
      if (this->attn_mask == 0) {
        local_1b0 = pMVar1 + 2;
      }
      if (lVar4 != 0xd8) {
        local_1b0 = pMVar1 + 2;
      }
      if (lVar4 == 0x90) {
        local_1b0 = local_88;
      }
    }
    if (this->attn_mask == 0) {
      local_258 = (void *)0x0;
      local_230 = (int *)0x0;
      lVar9 = 0;
      local_240 = (long *)0x0;
      local_21c = 0;
      iVar3 = 0;
      local_210 = 0;
    }
    else {
      local_258 = *(void **)((long)pMVar1 + lVar4 + -0x48);
      local_230 = *(int **)((long)pMVar1 + lVar4 + -0x40);
      lVar9 = *(long *)((long)pMVar1 + lVar4 + -0x38);
      local_240 = *(long **)((long)pMVar1 + lVar4 + -0x28);
      local_21c = *(int *)((long)pMVar1 + lVar4 + -0x20);
      iVar3 = *(int *)((long)pMVar1 + lVar4 + -0x1c);
      local_210 = *(long *)((long)pMVar1 + lVar4 + -8);
      if (local_230 != (int *)0x0) {
        LOCK();
        *local_230 = *local_230 + 1;
        UNLOCK();
      }
    }
    _h = pMVar1->h;
    uVar11 = (ulong)_h;
    _h_00 = local_88->h;
    uVar13 = (ulong)_h_00;
    _w = this->embed_dim / this->num_heads;
    _w_00 = this->weight_data_size / this->embed_dim;
    this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    Mat::create(this_00,_w_00,_h,4,opt->blob_allocator);
    iVar6 = -100;
    if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
      local_f8.cstep = 0;
      local_f8.data = (void *)0x0;
      local_f8.refcount._0_4_ = 0;
      local_f8.refcount._4_4_ = 0;
      local_f8.elemsize._0_4_ = 0;
      local_f8.elemsize._4_4_ = 0;
      local_f8.elempack = 0;
      local_f8.allocator = (Allocator *)0x0;
      local_f8.dims = 0;
      local_f8.w = 0;
      local_f8.h = 0;
      local_f8.d = 0;
      local_f8.c = 0;
      local_a0 = this_00;
      Mat::create(&local_f8,_w,_h,this->num_heads,4,opt->workspace_allocator);
      iVar6 = -100;
      if ((local_f8.data != (void *)0x0) && ((long)local_f8.c * local_f8.cstep != 0)) {
        local_148.cstep = 0;
        local_148.data = (void *)0x0;
        local_148.refcount._0_4_ = 0;
        local_148.refcount._4_4_ = 0;
        local_148.elemsize._0_4_ = 0;
        local_148.elemsize._4_4_ = 0;
        local_148.elempack = 0;
        local_148.allocator = (Allocator *)0x0;
        local_148.dims = 0;
        local_148.w = 0;
        local_148.h = 0;
        local_148.d = 0;
        local_148.c = 0;
        Mat::create(&local_148,_w,_h_00,this->num_heads,4,opt->workspace_allocator);
        iVar6 = -100;
        if ((local_148.data != (void *)0x0) && ((long)local_148.c * local_148.cstep != 0)) {
          local_198.cstep = 0;
          local_198.data = (void *)0x0;
          local_198.refcount._0_4_ = 0;
          local_198.refcount._4_4_ = 0;
          local_198.elemsize._0_4_ = 0;
          local_198.elemsize._4_4_ = 0;
          local_198.elempack = 0;
          local_198.allocator = (Allocator *)0x0;
          local_198.dims = 0;
          local_198.w = 0;
          local_198.h = 0;
          local_198.d = 0;
          local_198.c = 0;
          Mat::create(&local_198,_h_00,_w,this->num_heads,4,opt->workspace_allocator);
          iVar6 = -100;
          if ((local_198.data != (void *)0x0) && ((long)local_198.c * local_198.cstep != 0)) {
            local_208.cstep = 0;
            local_208.data = (void *)0x0;
            local_208.refcount._0_4_ = 0;
            local_208.refcount._4_4_ = 0;
            local_208.elemsize._0_4_ = 0;
            local_208.elemsize._4_4_ = 0;
            local_208.elempack = 0;
            local_208.allocator = (Allocator *)0x0;
            local_208.dims = 0;
            local_208.w = 0;
            local_208.h = 0;
            local_208.d = 0;
            local_208.c = 0;
            Mat::create(&local_208,_h_00,_h,this->num_heads,4,opt->workspace_allocator);
            iVar6 = -100;
            if ((local_208.data != (void *)0x0) && ((long)local_208.c * local_208.cstep != 0)) {
              local_78.cstep = 0;
              local_78.data = (void *)0x0;
              local_78.refcount._0_4_ = 0;
              local_78.refcount._4_4_ = 0;
              local_78.elemsize._0_4_ = 0;
              local_78.elemsize._4_4_ = 0;
              local_78.elempack = 0;
              local_78.allocator = (Allocator *)0x0;
              local_78.dims = 0;
              local_78.w = 0;
              local_78.h = 0;
              local_78.d = 0;
              local_78.c = 0;
              Mat::create(&local_78,_w,this->num_heads,_h,4,opt->workspace_allocator);
              iVar6 = -100;
              if ((local_78.data != (void *)0x0) && ((long)local_78.c * local_78.cstep != 0)) {
                local_98 = pMVar1;
                if (0 < this->num_heads) {
                  local_1c0 = (long)(int)_w;
                  uVar15 = (ulong)_w;
                  local_a8 = local_1c0 * (int)_w_00 * 4;
                  local_80 = (long)(int)_w_00 << 2;
                  local_b0 = local_1c0 * 4;
                  local_1a0 = iVar3 * lVar9;
                  local_218 = 0;
                  local_1b8 = 0;
                  local_248 = 0;
                  do {
                    if (0 < (int)_h) {
                      pvVar8 = (this->q_bias_data).data;
                      pvVar10 = (this->q_weight_data).data;
                      uVar7 = 0;
                      do {
                        if (0 < (int)_w) {
                          iVar3 = local_98->w;
                          sVar2 = local_98->elemsize;
                          pvVar12 = local_98->data;
                          uVar16 = 0;
                          lVar4 = (long)pvVar10 + local_1b8;
                          do {
                            fVar19 = *(float *)((long)pvVar8 + (uVar16 + local_248 * local_1c0) * 4)
                            ;
                            if (0 < (int)_w_00) {
                              lVar17 = 0;
                              do {
                                fVar19 = fVar19 + *(float *)(lVar4 + lVar17 * 4) *
                                                  *(float *)((long)pvVar12 +
                                                            lVar17 * 4 + sVar2 * uVar7 * (long)iVar3
                                                            );
                                lVar17 = lVar17 + 1;
                              } while (_w_00 != (uint)lVar17);
                            }
                            *(float *)((long)local_f8.data +
                                      uVar16 * 4 +
                                      (long)local_f8.w *
                                      CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize
                                              ) * uVar7 +
                                      local_f8.cstep * local_248 *
                                      CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize
                                              )) = fVar19 * this->scale;
                            uVar16 = uVar16 + 1;
                            lVar4 = lVar4 + local_80;
                          } while (uVar16 != uVar15);
                        }
                        uVar7 = uVar7 + 1;
                      } while (uVar7 != uVar11);
                    }
                    if (0 < (int)_h_00) {
                      iVar3 = this->kdim;
                      pvVar8 = (this->k_bias_data).data;
                      pvVar10 = (this->k_weight_data).data;
                      uVar7 = 0;
                      do {
                        if (0 < (int)_w) {
                          iVar6 = local_88->w;
                          sVar2 = local_88->elemsize;
                          pvVar12 = local_88->data;
                          uVar16 = 0;
                          pvVar14 = (void *)(local_218 * iVar3 + (long)pvVar10);
                          do {
                            fVar19 = *(float *)((long)pvVar8 + (uVar16 + local_248 * local_1c0) * 4)
                            ;
                            if (0 < iVar3) {
                              lVar4 = 0;
                              do {
                                fVar19 = fVar19 + *(float *)((long)pvVar14 + lVar4 * 4) *
                                                  *(float *)((long)pvVar12 +
                                                            lVar4 * 4 + sVar2 * uVar7 * (long)iVar6)
                                ;
                                lVar4 = lVar4 + 1;
                              } while (iVar3 != (int)lVar4);
                            }
                            *(float *)((long)local_148.data +
                                      uVar16 * 4 +
                                      (long)local_148.w *
                                      CONCAT44(local_148.elemsize._4_4_,
                                               (undefined4)local_148.elemsize) * uVar7 +
                                      local_148.cstep * local_248 *
                                      CONCAT44(local_148.elemsize._4_4_,
                                               (undefined4)local_148.elemsize)) = fVar19;
                            uVar16 = uVar16 + 1;
                            pvVar14 = (void *)((long)pvVar14 + (long)iVar3 * 4);
                          } while (uVar16 != uVar15);
                        }
                        uVar7 = uVar7 + 1;
                      } while (uVar7 != uVar13);
                    }
                    if (0 < (int)_w) {
                      iVar3 = this->vdim;
                      local_1a8 = local_248 * local_1c0;
                      pvVar8 = (this->v_bias_data).data;
                      pvVar10 = (void *)(local_218 * iVar3 + (long)(this->v_weight_data).data);
                      uVar7 = 0;
                      do {
                        if (0 < (int)_h_00) {
                          pvVar12 = local_1b0->data;
                          iVar6 = local_1b0->w;
                          sVar2 = local_1b0->elemsize;
                          uVar16 = 0;
                          do {
                            fVar19 = *(float *)((long)pvVar8 + (uVar7 + local_1a8) * 4);
                            if (0 < iVar3) {
                              lVar4 = 0;
                              do {
                                fVar19 = fVar19 + *(float *)((long)pvVar10 + lVar4 * 4) *
                                                  *(float *)((long)pvVar12 + lVar4 * 4);
                                lVar4 = lVar4 + 1;
                              } while (iVar3 != (int)lVar4);
                            }
                            *(float *)((long)local_198.data +
                                      uVar16 * 4 +
                                      (long)local_198.w *
                                      CONCAT44(local_198.elemsize._4_4_,
                                               (undefined4)local_198.elemsize) * uVar7 +
                                      local_198.cstep * local_248 *
                                      CONCAT44(local_198.elemsize._4_4_,
                                               (undefined4)local_198.elemsize)) = fVar19;
                            uVar16 = uVar16 + 1;
                            pvVar12 = (void *)((long)pvVar12 + (long)iVar6 * sVar2);
                          } while (uVar16 != uVar13);
                        }
                        uVar7 = uVar7 + 1;
                        pvVar10 = (void *)((long)pvVar10 + (long)iVar3 * 4);
                      } while (uVar7 != uVar15);
                    }
                    if (0 < (int)_h) {
                      pvVar8 = (void *)(local_f8.cstep *
                                        CONCAT44(local_f8.elemsize._4_4_,
                                                 (undefined4)local_f8.elemsize) * local_248 +
                                       (long)local_f8.data);
                      uVar7 = 0;
                      do {
                        if (0 < (int)_h_00) {
                          uVar16 = 0;
                          pvVar10 = (void *)(CONCAT44(local_148.elemsize._4_4_,
                                                      (undefined4)local_148.elemsize) *
                                             local_148.cstep * local_248 + (long)local_148.data);
                          do {
                            if ((int)_w < 1) {
                              fVar19 = 0.0;
                            }
                            else {
                              fVar19 = 0.0;
                              lVar4 = 0;
                              do {
                                fVar19 = fVar19 + *(float *)((long)pvVar10 + lVar4 * 4) *
                                                  *(float *)((long)pvVar8 + lVar4 * 4);
                                lVar4 = lVar4 + 1;
                              } while (_w != (uint)lVar4);
                            }
                            *(float *)((long)local_208.data +
                                      uVar16 * 4 +
                                      (long)local_208.w *
                                      CONCAT44(local_208.elemsize._4_4_,
                                               (undefined4)local_208.elemsize) * uVar7 +
                                      local_208.cstep * local_248 *
                                      CONCAT44(local_208.elemsize._4_4_,
                                               (undefined4)local_208.elemsize)) = fVar19;
                            uVar16 = uVar16 + 1;
                            pvVar10 = (void *)((long)pvVar10 +
                                              (long)local_148.w *
                                              CONCAT44(local_148.elemsize._4_4_,
                                                       (undefined4)local_148.elemsize));
                          } while (uVar16 != uVar13);
                        }
                        uVar7 = uVar7 + 1;
                        pvVar8 = (void *)((long)pvVar8 +
                                         (long)local_f8.w *
                                         CONCAT44(local_f8.elemsize._4_4_,
                                                  (undefined4)local_f8.elemsize));
                      } while (uVar7 != uVar11);
                    }
                    if (this->attn_mask != 0) {
                      if (local_21c == 3) {
                        piVar5 = (int *)0x0;
                        pvVar8 = (void *)(local_210 * lVar9 * local_248 + (long)local_258);
                      }
                      else {
                        piVar5 = local_230;
                        pvVar8 = local_258;
                        if (local_230 != (int *)0x0) {
                          LOCK();
                          *local_230 = *local_230 + 1;
                          UNLOCK();
                        }
                      }
                      if (0 < (int)_h) {
                        pvVar12 = (void *)(CONCAT44(local_208.elemsize._4_4_,
                                                    (undefined4)local_208.elemsize) *
                                           local_208.cstep * local_248 + (long)local_208.data);
                        uVar7 = 0;
                        pvVar10 = pvVar8;
                        do {
                          if (0 < (int)_h_00) {
                            uVar16 = 0;
                            do {
                              *(float *)((long)pvVar12 + uVar16 * 4) =
                                   *(float *)((long)pvVar12 + uVar16 * 4) +
                                   *(float *)((long)pvVar10 + uVar16 * 4);
                              uVar16 = uVar16 + 1;
                            } while (uVar13 != uVar16);
                          }
                          uVar7 = uVar7 + 1;
                          pvVar12 = (void *)((long)pvVar12 +
                                            (long)local_208.w *
                                            CONCAT44(local_208.elemsize._4_4_,
                                                     (undefined4)local_208.elemsize));
                          pvVar10 = (void *)((long)pvVar10 + local_1a0);
                        } while (uVar7 != uVar11);
                      }
                      if (piVar5 != (int *)0x0) {
                        LOCK();
                        *piVar5 = *piVar5 + -1;
                        UNLOCK();
                        if (*piVar5 == 0) {
                          if (local_240 == (long *)0x0) {
                            if (pvVar8 != (void *)0x0) {
                              free(pvVar8);
                            }
                          }
                          else {
                            (**(code **)(*local_240 + 0x18))();
                          }
                        }
                      }
                    }
                    if (0 < (int)_h) {
                      local_90 = (long)local_208.w *
                                 CONCAT44(local_208.elemsize._4_4_,(undefined4)local_208.elemsize);
                      pvVar8 = (void *)(CONCAT44(local_208.elemsize._4_4_,
                                                 (undefined4)local_208.elemsize) * local_208.cstep *
                                        local_248 + (long)local_208.data);
                      uVar7 = 0;
                      do {
                        fVar19 = -3.4028235e+38;
                        if (0 < (int)_h_00) {
                          uVar16 = 0;
                          fVar19 = -3.4028235e+38;
                          do {
                            fVar20 = *(float *)((long)pvVar8 + uVar16 * 4);
                            if (fVar19 <= fVar20) {
                              fVar19 = fVar20;
                            }
                            uVar16 = uVar16 + 1;
                          } while (uVar13 != uVar16);
                        }
                        fVar20 = 0.0;
                        if (0 < (int)_h_00) {
                          uVar16 = 0;
                          local_1a8 = CONCAT44(local_1a8._4_4_,fVar19);
                          do {
                            fVar19 = expf(*(float *)((long)pvVar8 + uVar16 * 4) - fVar19);
                            *(float *)((long)pvVar8 + uVar16 * 4) = fVar19;
                            fVar20 = fVar20 + fVar19;
                            uVar16 = uVar16 + 1;
                            fVar19 = (float)local_1a8;
                          } while (uVar13 != uVar16);
                        }
                        if (0 < (int)_h_00) {
                          uVar16 = 0;
                          do {
                            *(float *)((long)pvVar8 + uVar16 * 4) =
                                 *(float *)((long)pvVar8 + uVar16 * 4) * (1.0 / fVar20);
                            uVar16 = uVar16 + 1;
                          } while (uVar13 != uVar16);
                        }
                        uVar7 = uVar7 + 1;
                        pvVar8 = (void *)((long)pvVar8 + local_90);
                      } while (uVar7 != uVar11);
                    }
                    if (0 < (int)_h) {
                      pvVar8 = (void *)(local_208.cstep *
                                        CONCAT44(local_208.elemsize._4_4_,
                                                 (undefined4)local_208.elemsize) * local_248 +
                                       (long)local_208.data);
                      uVar7 = 0;
                      do {
                        if (0 < (int)_w) {
                          uVar16 = 0;
                          pvVar10 = (void *)(CONCAT44(local_198.elemsize._4_4_,
                                                      (undefined4)local_198.elemsize) *
                                             local_198.cstep * local_248 + (long)local_198.data);
                          do {
                            fVar19 = 0.0;
                            if (0 < (int)_h_00) {
                              lVar4 = 0;
                              do {
                                fVar19 = fVar19 + *(float *)((long)pvVar10 + lVar4 * 4) *
                                                  *(float *)((long)pvVar8 + lVar4 * 4);
                                lVar4 = lVar4 + 1;
                              } while (_h_00 != (uint)lVar4);
                            }
                            *(float *)((long)local_78.data +
                                      uVar16 * 4 +
                                      local_78.cstep *
                                      CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize
                                              ) * uVar7 +
                                      local_78.w * local_248 *
                                      CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize
                                              )) = fVar19;
                            uVar16 = uVar16 + 1;
                            pvVar10 = (void *)((long)pvVar10 +
                                              (long)local_198.w *
                                              CONCAT44(local_198.elemsize._4_4_,
                                                       (undefined4)local_198.elemsize));
                          } while (uVar16 != uVar15);
                        }
                        uVar7 = uVar7 + 1;
                        pvVar8 = (void *)((long)pvVar8 +
                                         (long)local_208.w *
                                         CONCAT44(local_208.elemsize._4_4_,
                                                  (undefined4)local_208.elemsize));
                      } while (uVar7 != uVar11);
                    }
                    local_248 = local_248 + 1;
                    local_1b8 = local_1b8 + local_a8;
                    local_218 = local_218 + local_b0;
                  } while (local_248 < this->num_heads);
                }
                if (0 < (int)_h) {
                  pvVar8 = local_a0->data;
                  iVar3 = local_a0->w;
                  sVar2 = local_a0->elemsize;
                  pvVar10 = (this->out_weight_data).data;
                  iVar6 = this->embed_dim;
                  pvVar12 = (this->out_bias_data).data;
                  uVar13 = 0;
                  pvVar14 = local_78.data;
                  do {
                    if (0 < (int)_w_00) {
                      uVar15 = 0;
                      pvVar18 = pvVar10;
                      do {
                        fVar19 = *(float *)((long)pvVar12 + uVar15 * 4);
                        if (0 < iVar6) {
                          lVar4 = 0;
                          do {
                            fVar19 = fVar19 + *(float *)((long)pvVar18 + lVar4 * 4) *
                                              *(float *)((long)pvVar14 + lVar4 * 4);
                            lVar4 = lVar4 + 1;
                          } while (iVar6 != (int)lVar4);
                        }
                        *(float *)((long)pvVar8 + uVar15 * 4 + (long)iVar3 * sVar2 * uVar13) =
                             fVar19;
                        uVar15 = uVar15 + 1;
                        pvVar18 = (void *)((long)pvVar18 + (long)iVar6 * 4);
                      } while (uVar15 != _w_00);
                    }
                    uVar13 = uVar13 + 1;
                    pvVar14 = (void *)((long)pvVar14 +
                                      local_78.cstep *
                                      CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize
                                              ));
                  } while (uVar13 != uVar11);
                }
                iVar6 = 0;
              }
              piVar5 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
              if (piVar5 != (int *)0x0) {
                LOCK();
                *piVar5 = *piVar5 + -1;
                UNLOCK();
                if (*piVar5 == 0) {
                  if (local_78.allocator == (Allocator *)0x0) {
                    if (local_78.data != (void *)0x0) {
                      free(local_78.data);
                    }
                  }
                  else {
                    (*(local_78.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              local_78.cstep = 0;
              local_78.data = (void *)0x0;
              local_78.refcount._0_4_ = 0;
              local_78.refcount._4_4_ = 0;
              local_78.elemsize._0_4_ = 0;
              local_78.elemsize._4_4_ = 0;
              local_78.elempack = 0;
              local_78.dims = 0;
              local_78.w = 0;
              local_78.h = 0;
              local_78.d = 0;
              local_78.c = 0;
            }
            piVar5 = (int *)CONCAT44(local_208.refcount._4_4_,local_208.refcount._0_4_);
            if (piVar5 != (int *)0x0) {
              LOCK();
              *piVar5 = *piVar5 + -1;
              UNLOCK();
              if (*piVar5 == 0) {
                if (local_208.allocator == (Allocator *)0x0) {
                  if (local_208.data != (void *)0x0) {
                    free(local_208.data);
                  }
                }
                else {
                  (*(local_208.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            local_208.cstep = 0;
            local_208.data = (void *)0x0;
            local_208.refcount._0_4_ = 0;
            local_208.refcount._4_4_ = 0;
            local_208.elemsize._0_4_ = 0;
            local_208.elemsize._4_4_ = 0;
            local_208.elempack = 0;
            local_208.dims = 0;
            local_208.w = 0;
            local_208.h = 0;
            local_208.d = 0;
            local_208.c = 0;
          }
          piVar5 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              if (local_198.allocator == (Allocator *)0x0) {
                if (local_198.data != (void *)0x0) {
                  free(local_198.data);
                }
              }
              else {
                (*(local_198.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_198.cstep = 0;
          local_198.data = (void *)0x0;
          local_198.refcount._0_4_ = 0;
          local_198.refcount._4_4_ = 0;
          local_198.elemsize._0_4_ = 0;
          local_198.elemsize._4_4_ = 0;
          local_198.elempack = 0;
          local_198.dims = 0;
          local_198.w = 0;
          local_198.h = 0;
          local_198.d = 0;
          local_198.c = 0;
        }
        piVar5 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (local_148.allocator == (Allocator *)0x0) {
              if (local_148.data != (void *)0x0) {
                free(local_148.data);
              }
            }
            else {
              (*(local_148.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_148.cstep = 0;
        local_148.data = (void *)0x0;
        local_148.refcount._0_4_ = 0;
        local_148.refcount._4_4_ = 0;
        local_148.elemsize._0_4_ = 0;
        local_148.elemsize._4_4_ = 0;
        local_148.elempack = 0;
        local_148.dims = 0;
        local_148.w = 0;
        local_148.h = 0;
        local_148.d = 0;
        local_148.c = 0;
      }
      piVar5 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_f8.allocator == (Allocator *)0x0) {
            if (local_f8.data != (void *)0x0) {
              free(local_f8.data);
            }
          }
          else {
            (*(local_f8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_f8.cstep = 0;
      local_f8.data = (void *)0x0;
      local_f8.refcount._0_4_ = 0;
      local_f8.refcount._4_4_ = 0;
      local_f8.elemsize._0_4_ = 0;
      local_f8.elemsize._4_4_ = 0;
      local_f8.elempack = 0;
      local_f8.dims = 0;
      local_f8.w = 0;
      local_f8.h = 0;
      local_f8.d = 0;
      local_f8.c = 0;
    }
    if (local_230 != (int *)0x0) {
      LOCK();
      *local_230 = *local_230 + -1;
      UNLOCK();
      if (*local_230 == 0) {
        if (local_240 == (long *)0x0) {
          if (local_258 != (void *)0x0) {
            free(local_258);
          }
        }
        else {
          (**(code **)(*local_240 + 0x18))(local_240,local_258);
        }
      }
    }
    return iVar6;
  }
  iVar3 = forward_int8(this,bottom_blobs,top_blobs,opt);
  return iVar3;
}

Assistant:

int MultiHeadAttention::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
#if NCNN_INT8
    if (int8_scale_term)
    {
        return forward_int8(bottom_blobs, top_blobs, opt);
    }
#endif

    const Mat& q_blob = bottom_blobs[0];
    const Mat& k_blob = (bottom_blobs.size() == 1 || (bottom_blobs.size() == 2 && attn_mask)) ? q_blob : bottom_blobs[1];
    const Mat& v_blob = (bottom_blobs.size() == 1 || (bottom_blobs.size() == 2 && attn_mask)) ? q_blob : (bottom_blobs.size() == 2 || (bottom_blobs.size() == 3 && attn_mask)) ? k_blob : bottom_blobs[2];
    const Mat& attn_mask_blob = attn_mask ? bottom_blobs[bottom_blobs.size() - 1] : Mat();

    const int src_seqlen = q_blob.h;
    const int dst_seqlen = k_blob.h;
    const int embed_dim_per_head = embed_dim / num_heads;
    const int qdim = weight_data_size / embed_dim;

    // assert k_blob.h == v_blob.h

    Mat& top_blob = top_blobs[0];
    top_blob.create(qdim, src_seqlen, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    Mat xq(embed_dim_per_head, src_seqlen, num_heads, 4u, opt.workspace_allocator);
    if (xq.empty())
        return -100;
    Mat xk(embed_dim_per_head, dst_seqlen, num_heads, 4u, opt.workspace_allocator);
    if (xk.empty())
        return -100;
    Mat xv(dst_seqlen, embed_dim_per_head, num_heads, 4u, opt.workspace_allocator);
    if (xv.empty())
        return -100;

    Mat xqk(dst_seqlen, src_seqlen, num_heads, 4u, opt.workspace_allocator);
    if (xqk.empty())
        return -100;

    Mat xqkv(embed_dim_per_head, num_heads, src_seqlen, 4u, opt.workspace_allocator);
    if (xqkv.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < num_heads; q++)
    {
        // xq = affine(q) * scale
        {
            Mat outm = xq.channel(q);

            for (int i = 0; i < src_seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const float* ptr = q_blob.row(i);
                    const float* kptr = (const float*)q_weight_data + qdim * (q * embed_dim_per_head + j);

                    float sum = q_bias_data[q * embed_dim_per_head + j];
                    for (int k = 0; k < qdim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }

                    outptr[j] = sum * scale;
                }
            }
        }

        // xk = affine(k)
        {
            Mat outm = xk.channel(q);

            for (int i = 0; i < dst_seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const float* ptr = k_blob.row(i);
                    const float* kptr = (const float*)k_weight_data + kdim * (q * embed_dim_per_head + j);

                    float sum = k_bias_data[q * embed_dim_per_head + j];
                    for (int k = 0; k < kdim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }

                    outptr[j] = sum;
                }
            }
        }

        // xv = affine(v)
        {
            Mat outm = xv.channel(q);

            for (int i = 0; i < embed_dim_per_head; i++)
            {
                for (int j = 0; j < dst_seqlen; j++)
                {
                    const float* ptr = v_blob.row(j);
                    const float* kptr = (const float*)v_weight_data + vdim * (q * embed_dim_per_head + i);

                    float sum = v_bias_data[q * embed_dim_per_head + i];
                    for (int k = 0; k < vdim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }

                    float* outptr = outm.row(i);

                    outptr[j] = sum;
                }
            }
        }

        // xqk = xq * xk
        // xq  (embed_dim_per_head, src_seqlen)
        // xk  (embed_dim_per_head, dst_seqlen)
        {
            const Mat xqm = xq.channel(q);
            const Mat xkm = xk.channel(q);

            Mat outm = xqk.channel(q);

            for (int i = 0; i < src_seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < dst_seqlen; j++)
                {
                    const float* qptr = xqm.row(i);
                    const float* kptr = xkm.row(j);

                    float sum = 0.f;
                    for (int k = 0; k < embed_dim_per_head; k++)
                    {
                        sum += *qptr++ * *kptr++;
                    }

                    outptr[j] = sum;
                }
            }
        }

        // xqk = xqk + mask
        if (attn_mask)
        {
            const Mat& maskm = attn_mask_blob.dims == 3 ? attn_mask_blob.channel(q) : attn_mask_blob;
            Mat outm = xqk.channel(q);

            for (int i = 0; i < src_seqlen; i++)
            {
                const float* mptr = maskm.row(i);
                float* outptr = outm.row(i);

                for (int j = 0; j < dst_seqlen; j++)
                {
                    outptr[j] += mptr[j];
                }
            }
        }

        // softmax(xqk)
        {
            Mat outm = xqk.channel(q);

            for (int i = 0; i < src_seqlen; i++)
            {
                float* ptr = outm.row(i);

                float max = -FLT_MAX;
                for (int j = 0; j < dst_seqlen; j++)
                {
                    max = std::max(max, ptr[j]);
                }

                float sum = 0.f;
                for (int j = 0; j < dst_seqlen; j++)
                {
                    ptr[j] = (float)(expf(ptr[j] - max));
                    sum += ptr[j];
                }

                for (int j = 0; j < dst_seqlen; j++)
                {
                    ptr[j] /= sum;
                }
            }
        }

        // xqkv = xqk * xv
        // xqk (dst_seqlen, src_seqlen)
        // xv  (dst_seqlen, embed_dim_per_head)
        // out (embed_dim_per_head, num_heads, src_seqlen)
        {
            const Mat xqkm = xqk.channel(q);
            const Mat xvm = xv.channel(q);

            for (int i = 0; i < src_seqlen; i++)
            {
                float* outptr = xqkv.channel(i).row(q);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const float* qkptr = xqkm.row(i);
                    const float* vptr = xvm.row(j);

                    float sum = 0.f;
                    for (int k = 0; k < dst_seqlen; k++)
                    {
                        sum += *qkptr++ * *vptr++;
                    }

                    outptr[j] = sum;
                }
            }
        }
    }

    // out = affine(xqkv)
    // xqkv  (embed_dim, src_seqlen)
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < src_seqlen; i++)
    {
        float* outptr = top_blob.row(i);

        for (int j = 0; j < qdim; j++)
        {
            const float* ptr = xqkv.channel(i);
            const float* kptr = (const float*)out_weight_data + embed_dim * j;

            float sum = out_bias_data[j];
            for (int k = 0; k < embed_dim; k++)
            {
                sum += *ptr++ * *kptr++;
            }

            outptr[j] = sum;
        }
    }

    return 0;
}